

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cppwriteinitialization.cpp
# Opt level: O2

void CPP::generateMultiDirectiveBegin(QTextStream *outputStream,QSet<QString> *directives)

{
  byte bVar1;
  Data *pDVar2;
  size_t sVar3;
  Span *pSVar4;
  Entry *pEVar5;
  qsizetype qVar6;
  iterator iVar7;
  iterator iVar8;
  QTextStream *pQVar9;
  ulong uVar10;
  long lVar11;
  long in_FS_OFFSET;
  const_iterator cVar12;
  qtConfig local_68;
  QArrayDataPointer<QString> local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  pDVar2 = (directives->q_hash).d;
  if ((pDVar2 != (Data *)0x0) && (sVar3 = pDVar2->size, sVar3 != 0)) {
    if (sVar3 == 1) {
      cVar12 = QHash<QString,_QHashDummyValue>::begin(&directives->q_hash);
      pSVar4 = (cVar12.i.d)->spans;
      uVar10 = cVar12.i.bucket >> 7;
      pEVar5 = pSVar4[uVar10].entries;
      bVar1 = pSVar4[uVar10].offsets[(uint)cVar12.i.bucket & 0x7f];
      local_58.ptr = *(QString **)(pEVar5[bVar1].storage.data + 8);
      local_58.d = *(Data **)(pEVar5[bVar1].storage.data + 0x10);
      language::operator<<(outputStream,(openQtConfig *)&local_58);
    }
    else {
      local_58.size = 0xaaaaaaaaaaaaaaaa;
      local_58.d = (Data *)0xaaaaaaaaaaaaaaaa;
      local_58.ptr = (QString *)0xaaaaaaaaaaaaaaaa;
      QSet<QString>::values((QList<QString> *)&local_58,directives);
      iVar7 = QList<QString>::begin((QList<QString> *)&local_58);
      iVar8 = QList<QString>::end((QList<QString> *)&local_58);
      std::__sort<QList<QString>::iterator,__gnu_cxx::__ops::_Iter_less_iter>(iVar7.i,iVar8.i);
      pQVar9 = (QTextStream *)QTextStream::operator<<(outputStream,"#if ");
      local_68.super_StringViewStreamable.m_parameter.m_data = ((local_58.ptr)->d).ptr;
      local_68.super_StringViewStreamable.m_parameter.m_size = ((local_58.ptr)->d).size;
      language::operator<<(pQVar9,&local_68);
      qVar6 = local_58.size;
      lVar11 = 0x28;
      for (uVar10 = 1; uVar10 < (ulong)qVar6; uVar10 = uVar10 + 1) {
        pQVar9 = (QTextStream *)QTextStream::operator<<(outputStream," || ");
        local_68.super_StringViewStreamable.m_parameter.m_data =
             *(storage_type_conflict **)((long)local_58.ptr + lVar11 + -8);
        local_68.super_StringViewStreamable.m_parameter.m_size =
             *(qsizetype *)((long)&((local_58.ptr)->d).d + lVar11);
        language::operator<<(pQVar9,&local_68);
        lVar11 = lVar11 + 0x18;
      }
      Qt::endl(outputStream);
      QArrayDataPointer<QString>::~QArrayDataPointer(&local_58);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

static void generateMultiDirectiveBegin(QTextStream &outputStream, const QSet<QString> &directives)
{
    if (directives.isEmpty())
        return;

    if (directives.size() == 1) {
        outputStream << language::openQtConfig(*directives.cbegin());
        return;
    }

    auto list = directives.values();
    // sort (always generate in the same order):
    std::sort(list.begin(), list.end());

    outputStream << "#if " << language::qtConfig(list.constFirst());
    for (qsizetype i = 1, size = list.size(); i < size; ++i)
        outputStream << " || " << language::qtConfig(list.at(i));
    outputStream << Qt::endl;
}